

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-connect.c
# Opt level: O2

int run_test_udp_connect(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  char *pcVar3;
  undefined8 uStack_180;
  int addrlen;
  sockaddr_in ext_addr;
  sockaddr_in tmp_addr;
  uv_udp_send_t req;
  
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&lo_addr);
  if (iVar1 == 0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_udp_init(puVar2,&server);
    if (iVar1 == 0) {
      iVar1 = uv_udp_bind(&server,(sockaddr *)&lo_addr,0);
      if (iVar1 == 0) {
        iVar1 = uv_udp_recv_start(&server,alloc_cb,sv_recv_cb);
        if (iVar1 == 0) {
          puVar2 = uv_default_loop();
          iVar1 = uv_udp_init(puVar2,&client);
          if (iVar1 == 0) {
            buf = uv_buf_init("EXIT",4);
            iVar1 = uv_ip4_addr("8.8.8.8",0x23a3,&ext_addr);
            if (iVar1 == 0) {
              iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&lo_addr);
              if (iVar1 == 0) {
                iVar1 = uv_udp_connect(&client,(sockaddr *)&lo_addr);
                if (iVar1 == 0) {
                  iVar1 = uv_udp_connect(&client,(sockaddr *)&ext_addr);
                  if (iVar1 == -0x6a) {
                    addrlen = 0x10;
                    iVar1 = uv_udp_getpeername(&client,(sockaddr *)&tmp_addr,&addrlen);
                    if (iVar1 == 0) {
                      iVar1 = uv_udp_try_send(&client,&buf,1,(sockaddr *)&lo_addr);
                      if (iVar1 == -0x6a) {
                        iVar1 = uv_udp_try_send(&client,&buf,1,(sockaddr *)0x0);
                        if (iVar1 == 4) {
                          iVar1 = uv_udp_try_send(&client,&buf,1,(sockaddr *)&ext_addr);
                          if (iVar1 == -0x6a) {
                            iVar1 = uv_udp_connect(&client,(sockaddr *)0x0);
                            if (iVar1 == 0) {
                              iVar1 = uv_udp_connect(&client,(sockaddr *)0x0);
                              if (iVar1 == -0x6b) {
                                addrlen = 0x10;
                                iVar1 = uv_udp_getpeername(&client,(sockaddr *)&tmp_addr,&addrlen);
                                if (iVar1 == -0x6b) {
                                  iVar1 = uv_udp_try_send(&client,&buf,1,(sockaddr *)&lo_addr);
                                  if (iVar1 == 4) {
                                    iVar1 = uv_udp_try_send(&client,&buf,1,(sockaddr *)0x0);
                                    if (iVar1 == -0x59) {
                                      iVar1 = uv_udp_connect(&client,(sockaddr *)&lo_addr);
                                      if (iVar1 == 0) {
                                        iVar1 = uv_udp_send(&req,&client,&buf,1,(sockaddr *)&lo_addr
                                                            ,cl_send_cb);
                                        if (iVar1 == -0x6a) {
                                          iVar1 = uv_udp_send(&req,&client,&buf,1,(sockaddr *)0x0,
                                                              cl_send_cb);
                                          if (iVar1 == 0) {
                                            puVar2 = uv_default_loop();
                                            uv_run(puVar2,UV_RUN_DEFAULT);
                                            if (close_cb_called == 2) {
                                              if (sv_recv_cb_called == 4) {
                                                if (cl_send_cb_called == 2) {
                                                  if (client.send_queue_size == 0) {
                                                    if (server.send_queue_size == 0) {
                                                      puVar2 = uv_default_loop();
                                                      uv_walk(puVar2,close_walk_cb,(void *)0x0);
                                                      uv_run(puVar2,UV_RUN_DEFAULT);
                                                      puVar2 = uv_default_loop();
                                                      iVar1 = uv_loop_close(puVar2);
                                                      if (iVar1 == 0) {
                                                        return 0;
                                                      }
                                                      pcVar3 = 
                                                  "0 == uv_loop_close(uv_default_loop())";
                                                  uStack_180 = 0xb4;
                                                  }
                                                  else {
                                                    pcVar3 = "server.send_queue_size == 0";
                                                    uStack_180 = 0xb2;
                                                  }
                                                  }
                                                  else {
                                                    pcVar3 = "client.send_queue_size == 0";
                                                    uStack_180 = 0xb1;
                                                  }
                                                }
                                                else {
                                                  pcVar3 = "cl_send_cb_called == 2";
                                                  uStack_180 = 0xaf;
                                                }
                                              }
                                              else {
                                                pcVar3 = "sv_recv_cb_called == 4";
                                                uStack_180 = 0xae;
                                              }
                                            }
                                            else {
                                              pcVar3 = "close_cb_called == 2";
                                              uStack_180 = 0xad;
                                            }
                                          }
                                          else {
                                            pcVar3 = "r == 0";
                                            uStack_180 = 0xa9;
                                          }
                                        }
                                        else {
                                          pcVar3 = "r == UV_EISCONN";
                                          uStack_180 = 0xa7;
                                        }
                                      }
                                      else {
                                        pcVar3 = "r == 0";
                                        uStack_180 = 0xa0;
                                      }
                                    }
                                    else {
                                      pcVar3 = "r == UV_EDESTADDRREQ";
                                      uStack_180 = 0x9c;
                                    }
                                  }
                                  else {
                                    pcVar3 = "r == 4";
                                    uStack_180 = 0x9a;
                                  }
                                }
                                else {
                                  pcVar3 = "r == UV_ENOTCONN";
                                  uStack_180 = 0x96;
                                }
                              }
                              else {
                                pcVar3 = "r == UV_ENOTCONN";
                                uStack_180 = 0x92;
                              }
                            }
                            else {
                              pcVar3 = "r == 0";
                              uStack_180 = 0x90;
                            }
                          }
                          else {
                            pcVar3 = "r == UV_EISCONN";
                            uStack_180 = 0x8d;
                          }
                        }
                        else {
                          pcVar3 = "r == 4";
                          uStack_180 = 0x8b;
                        }
                      }
                      else {
                        pcVar3 = "r == UV_EISCONN";
                        uStack_180 = 0x89;
                      }
                    }
                    else {
                      pcVar3 = "r == 0";
                      uStack_180 = 0x85;
                    }
                  }
                  else {
                    pcVar3 = "r == UV_EISCONN";
                    uStack_180 = 0x81;
                  }
                }
                else {
                  pcVar3 = "r == 0";
                  uStack_180 = 0x7f;
                }
              }
              else {
                pcVar3 = "0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &lo_addr)";
                uStack_180 = 0x7c;
              }
            }
            else {
              pcVar3 = "0 == uv_ip4_addr(\"8.8.8.8\", TEST_PORT, &ext_addr)";
              uStack_180 = 0x7b;
            }
          }
          else {
            pcVar3 = "r == 0";
            uStack_180 = 0x77;
          }
        }
        else {
          pcVar3 = "r == 0";
          uStack_180 = 0x74;
        }
      }
      else {
        pcVar3 = "r == 0";
        uStack_180 = 0x71;
      }
    }
    else {
      pcVar3 = "r == 0";
      uStack_180 = 0x6e;
    }
  }
  else {
    pcVar3 = "0 == uv_ip4_addr(\"0.0.0.0\", TEST_PORT, &lo_addr)";
    uStack_180 = 0x6b;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-connect.c"
          ,uStack_180,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(udp_connect) {
  uv_udp_send_t req;
  struct sockaddr_in ext_addr;
  struct sockaddr_in tmp_addr;
  int r;
  int addrlen;

  ASSERT(0 == uv_ip4_addr("0.0.0.0", TEST_PORT, &lo_addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT(r == 0);

  r = uv_udp_bind(&server, (const struct sockaddr*) &lo_addr, 0);
  ASSERT(r == 0);

  r = uv_udp_recv_start(&server, alloc_cb, sv_recv_cb);
  ASSERT(r == 0);

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT(r == 0);

  buf = uv_buf_init("EXIT", 4);

  ASSERT(0 == uv_ip4_addr("8.8.8.8", TEST_PORT, &ext_addr));
  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &lo_addr));

  r = uv_udp_connect(&client, (const struct sockaddr*) &lo_addr);
  ASSERT(r == 0);
  r = uv_udp_connect(&client, (const struct sockaddr*) &ext_addr);
  ASSERT(r == UV_EISCONN);

  addrlen = sizeof(tmp_addr);
  r = uv_udp_getpeername(&client, (struct sockaddr*) &tmp_addr, &addrlen);
  ASSERT(r == 0);

  /* To send messages in connected UDP sockets addr must be NULL */
  r = uv_udp_try_send(&client, &buf, 1, (const struct sockaddr*) &lo_addr);
  ASSERT(r == UV_EISCONN);
  r = uv_udp_try_send(&client, &buf, 1, NULL);
  ASSERT(r == 4);
  r = uv_udp_try_send(&client, &buf, 1, (const struct sockaddr*) &ext_addr);
  ASSERT(r == UV_EISCONN);

  r = uv_udp_connect(&client, NULL);
  ASSERT(r == 0);
  r = uv_udp_connect(&client, NULL);
  ASSERT(r == UV_ENOTCONN);

  addrlen = sizeof(tmp_addr);
  r = uv_udp_getpeername(&client, (struct sockaddr*) &tmp_addr, &addrlen);
  ASSERT(r == UV_ENOTCONN);

  /* To send messages in disconnected UDP sockets addr must be set */
  r = uv_udp_try_send(&client, &buf, 1, (const struct sockaddr*) &lo_addr);
  ASSERT(r == 4);
  r = uv_udp_try_send(&client, &buf, 1, NULL);
  ASSERT(r == UV_EDESTADDRREQ);


  r = uv_udp_connect(&client, (const struct sockaddr*) &lo_addr);
  ASSERT(r == 0);
  r = uv_udp_send(&req,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &lo_addr,
                  cl_send_cb);
  ASSERT(r == UV_EISCONN);
  r = uv_udp_send(&req, &client, &buf, 1, NULL, cl_send_cb);
  ASSERT(r == 0);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(close_cb_called == 2);
  ASSERT(sv_recv_cb_called == 4);
  ASSERT(cl_send_cb_called == 2);

  ASSERT(client.send_queue_size == 0);
  ASSERT(server.send_queue_size == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}